

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rune.cc
# Opt level: O2

int duckdb_re2::fullrune(char *str,int n)

{
  byte bVar1;
  
  if ((0 < n) &&
     ((bVar1 = *str, -1 < (char)bVar1 ||
      ((n != 1 && ((bVar1 < 0xe0 || ((2 < (uint)n && (n != 3 || bVar1 < 0xf0)))))))))) {
    return 1;
  }
  return 0;
}

Assistant:

int
fullrune(const char *str, int n)
{
	if (n > 0) {
		int c = *(unsigned char*)str;
		if (c < Tx)
			return 1;
		if (n > 1) {
			if (c < T3)
				return 1;
			if (n > 2) {
				if (c < T4 || n > 3)
					return 1;
			}
		}
	}
	return 0;
}